

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O2

DatabaseName * __thiscall
DatabaseName::derive_temporary(DatabaseName *__return_storage_ptr__,DatabaseName *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string fname;
  string id;
  path local_58;
  
  random_hex_string_abi_cxx11_(&id,8);
  std::operator+(&bStack_118,"temp.",&id);
  std::operator+(&fname,&bStack_118,".ursa");
  std::__cxx11::string::~string((string *)&bStack_118);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_58,&this->db_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"temp",(allocator<char> *)&bStack_118);
  std::__cxx11::string::string((string *)&local_d8,(string *)&id);
  std::__cxx11::string::string((string *)&local_f8,(string *)&fname);
  DatabaseName(__return_storage_ptr__,&local_58,&local_b8,&local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_58);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&id);
  return __return_storage_ptr__;
}

Assistant:

DatabaseName DatabaseName::derive_temporary() const {
    std::string id = random_hex_string(8);
    std::string fname = "temp." + id + ".ursa";
    return DatabaseName(db_base, "temp", id, fname);
}